

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O0

void google::protobuf::TestUtilLite::ModifyRepeatedFields(TestAllTypesLite *message)

{
  TestAllTypesLite_RepeatedGroup *this;
  TestAllTypesLite_NestedMessage *pTVar1;
  ForeignMessageLite *this_00;
  ImportMessageLite *this_01;
  TestAllTypesLite *message_local;
  
  proto2_unittest::TestAllTypesLite::set_repeated_int32(message,1,0x1f5);
  proto2_unittest::TestAllTypesLite::set_repeated_int64(message,1,0x1f6);
  proto2_unittest::TestAllTypesLite::set_repeated_uint32(message,1,0x1f7);
  proto2_unittest::TestAllTypesLite::set_repeated_uint64(message,1,0x1f8);
  proto2_unittest::TestAllTypesLite::set_repeated_sint32(message,1,0x1f9);
  proto2_unittest::TestAllTypesLite::set_repeated_sint64(message,1,0x1fa);
  proto2_unittest::TestAllTypesLite::set_repeated_fixed32(message,1,0x1fb);
  proto2_unittest::TestAllTypesLite::set_repeated_fixed64(message,1,0x1fc);
  proto2_unittest::TestAllTypesLite::set_repeated_sfixed32(message,1,0x1fd);
  proto2_unittest::TestAllTypesLite::set_repeated_sfixed64(message,1,0x1fe);
  proto2_unittest::TestAllTypesLite::set_repeated_float(message,1,511.0);
  proto2_unittest::TestAllTypesLite::set_repeated_double(message,1,512.0);
  proto2_unittest::TestAllTypesLite::set_repeated_bool(message,1,true);
  proto2_unittest::TestAllTypesLite::set_repeated_string<char_const(&)[4]>
            (message,1,(char (*) [4])"515");
  proto2_unittest::TestAllTypesLite::set_repeated_bytes<char_const(&)[4]>
            (message,1,(char (*) [4])"516");
  this = proto2_unittest::TestAllTypesLite::mutable_repeatedgroup(message,1);
  proto2_unittest::TestAllTypesLite_RepeatedGroup::set_a(this,0x205);
  pTVar1 = proto2_unittest::TestAllTypesLite::mutable_repeated_nested_message(message,1);
  proto2_unittest::TestAllTypesLite_NestedMessage::set_bb(pTVar1,0x206);
  this_00 = proto2_unittest::TestAllTypesLite::mutable_repeated_foreign_message(message,1);
  proto2_unittest::ForeignMessageLite::set_c(this_00,0x207);
  this_01 = proto2_unittest::TestAllTypesLite::mutable_repeated_import_message(message,1);
  proto2_unittest_import::ImportMessageLite::set_d(this_01,0x208);
  pTVar1 = proto2_unittest::TestAllTypesLite::mutable_repeated_lazy_message(message,1);
  proto2_unittest::TestAllTypesLite_NestedMessage::set_bb(pTVar1,0x20f);
  proto2_unittest::TestAllTypesLite::set_repeated_nested_enum
            (message,1,TestAllTypesLite_NestedEnum_FOO);
  proto2_unittest::TestAllTypesLite::set_repeated_foreign_enum(message,1,FOREIGN_LITE_FOO);
  proto2_unittest::TestAllTypesLite::set_repeated_import_enum(message,1,IMPORT_LITE_FOO);
  return;
}

Assistant:

void TestUtilLite::ModifyRepeatedFields(unittest::TestAllTypesLite* message) {
  message->set_repeated_int32(1, 501);
  message->set_repeated_int64(1, 502);
  message->set_repeated_uint32(1, 503);
  message->set_repeated_uint64(1, 504);
  message->set_repeated_sint32(1, 505);
  message->set_repeated_sint64(1, 506);
  message->set_repeated_fixed32(1, 507);
  message->set_repeated_fixed64(1, 508);
  message->set_repeated_sfixed32(1, 509);
  message->set_repeated_sfixed64(1, 510);
  message->set_repeated_float(1, 511);
  message->set_repeated_double(1, 512);
  message->set_repeated_bool(1, true);
  message->set_repeated_string(1, "515");
  message->set_repeated_bytes(1, "516");

  message->mutable_repeatedgroup(1)->set_a(517);
  message->mutable_repeated_nested_message(1)->set_bb(518);
  message->mutable_repeated_foreign_message(1)->set_c(519);
  message->mutable_repeated_import_message(1)->set_d(520);
  message->mutable_repeated_lazy_message(1)->set_bb(527);

  message->set_repeated_nested_enum(1, unittest::TestAllTypesLite::FOO);
  message->set_repeated_foreign_enum(1, unittest::FOREIGN_LITE_FOO);
  message->set_repeated_import_enum(1, unittest_import::IMPORT_LITE_FOO);

}